

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void XML_ParserFree(XML_Parser parser)

{
  NAMED **ppNVar1;
  tag *ptVar2;
  binding *pbVar3;
  DTD *table;
  XML_Parser pXVar4;
  bool bVar5;
  NAMED *pNVar6;
  TAG *pTVar7;
  BINDING *pBVar8;
  OPEN_INTERNAL_ENTITY *pOVar9;
  OPEN_INTERNAL_ENTITY *pOVar10;
  NAMED **ppNVar11;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  pTVar7 = parser->m_tagStack;
  do {
    if (pTVar7 == (TAG *)0x0) {
      pTVar7 = parser->m_freeTagList;
      if (pTVar7 != (TAG *)0x0) {
        parser->m_freeTagList = (TAG *)0x0;
        goto LAB_003dcd09;
      }
      bVar5 = false;
      pTVar7 = (tag *)0x0;
    }
    else {
LAB_003dcd09:
      ptVar2 = pTVar7->parent;
      (*(parser->m_mem).free_fcn)(pTVar7->buf);
      pBVar8 = pTVar7->bindings;
      while (pBVar8 != (BINDING *)0x0) {
        pbVar3 = pBVar8->nextTagBinding;
        (*(parser->m_mem).free_fcn)(pBVar8->uri);
        (*(parser->m_mem).free_fcn)(pBVar8);
        pBVar8 = pbVar3;
      }
      (*(parser->m_mem).free_fcn)(pTVar7);
      bVar5 = true;
      pTVar7 = ptVar2;
    }
  } while (bVar5);
  pOVar10 = parser->m_openInternalEntities;
  do {
    pOVar9 = pOVar10;
    if (pOVar10 == (OPEN_INTERNAL_ENTITY *)0x0) {
      pOVar9 = parser->m_freeInternalEntities;
      if (pOVar9 != (OPEN_INTERNAL_ENTITY *)0x0) {
        parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
        goto LAB_003dcd7b;
      }
      bVar5 = false;
      pOVar10 = (open_internal_entity *)0x0;
    }
    else {
LAB_003dcd7b:
      pOVar10 = pOVar9->next;
      (*(parser->m_mem).free_fcn)(pOVar9);
      bVar5 = true;
    }
  } while (bVar5);
  pBVar8 = parser->m_freeBindingList;
  while (pBVar8 != (BINDING *)0x0) {
    pbVar3 = pBVar8->nextTagBinding;
    (*(parser->m_mem).free_fcn)(pBVar8->uri);
    (*(parser->m_mem).free_fcn)(pBVar8);
    pBVar8 = pbVar3;
  }
  pBVar8 = parser->m_inheritedBindings;
  while (pBVar8 != (BINDING *)0x0) {
    pbVar3 = pBVar8->nextTagBinding;
    (*(parser->m_mem).free_fcn)(pBVar8->uri);
    (*(parser->m_mem).free_fcn)(pBVar8);
    pBVar8 = pbVar3;
  }
  poolDestroy(&parser->m_tempPool);
  poolDestroy(&parser->m_temp2Pool);
  (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
  table = parser->m_dtd;
  if (table != (DTD *)0x0) {
    pXVar4 = parser->m_parentParser;
    ppNVar11 = (table->elementTypes).v;
    ppNVar1 = ppNVar11 + (table->elementTypes).size;
LAB_003dce36:
    if (ppNVar11 != ppNVar1) goto code_r0x003dce3b;
    pNVar6 = (NAMED *)0x0;
    goto LAB_003dce50;
  }
LAB_003dcebd:
  (*(parser->m_mem).free_fcn)(parser->m_atts);
  (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
  (*(parser->m_mem).free_fcn)(parser->m_buffer);
  (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
  (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
  (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
    (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
  }
  (*(parser->m_mem).free_fcn)(parser);
  return;
code_r0x003dce3b:
  pNVar6 = *ppNVar11;
  ppNVar11 = ppNVar11 + 1;
  if (pNVar6 == (NAMED *)0x0) goto LAB_003dce36;
LAB_003dce50:
  if (pNVar6 != (NAMED *)0x0) {
    if (*(int *)((long)&pNVar6[3].name + 4) != 0) {
      (*(parser->m_mem).free_fcn)(pNVar6[4].name);
    }
    goto LAB_003dce36;
  }
  hashTableDestroy(&table->generalEntities);
  hashTableDestroy(&table->elementTypes);
  hashTableDestroy(&table->attributeIds);
  hashTableDestroy(&table->prefixes);
  poolDestroy(&table->pool);
  poolDestroy(&table->entityValuePool);
  if (pXVar4 == (XML_Parser)0x0) {
    (*(parser->m_mem).free_fcn)(table->scaffIndex);
    (*(parser->m_mem).free_fcn)(table->scaffold);
  }
  (*(parser->m_mem).free_fcn)(table);
  goto LAB_003dcebd;
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser)
{
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free tagStack and freeTagList */
  tagList = tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (freeTagList == NULL)
        break;
      tagList = freeTagList;
      freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  /* free openInternalEntities and freeInternalEntities */
  entityList = openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (freeInternalEntities == NULL)
        break;
      entityList = freeInternalEntities;
      freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(openEntity);
  }

  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
  FREE((void *)protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (!isParamEntity && _dtd)
#else
  if (_dtd)
#endif /* XML_DTD */
    dtdDestroy(_dtd, (XML_Bool)!parentParser, &parser->m_mem);
  FREE((void *)atts);
#ifdef XML_ATTR_INFO
  FREE((void *)attInfo);
#endif
  FREE(groupConnector);
  FREE(buffer);
  FREE(dataBuf);
  FREE(nsAtts);
  FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}